

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10a9f7::CompressorState::process
          (CompressorState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  float *pfVar1;
  size_t sVar2;
  const_reference pvVar3;
  iterator paVar4;
  iterator paVar5;
  reference pvVar6;
  ulong in_RSI;
  array<float,_1024UL> *in_RDI;
  float fVar7;
  double dVar8;
  size_t i_2;
  float gain;
  FloatBufferLine *output;
  iterator __end3;
  iterator __begin3;
  span<std::array<float,_1024UL>,_18446744073709551615UL> *__range3;
  float *outgains;
  array<float,_1024UL> *input;
  iterator __end2;
  iterator __begin2;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> *__range2;
  float (*changains) [16];
  float amplitude_1;
  size_t i_1;
  float amplitude;
  size_t i;
  float env;
  size_t td;
  float gains [256];
  size_t base;
  float in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb2c;
  ulong local_4c8;
  iterator local_4a8;
  float *local_498;
  iterator local_480;
  float *local_470;
  ulong local_460;
  ulong local_450;
  float local_444;
  float afStack_438 [256];
  ulong local_38;
  ulong local_30;
  span<std::array<float,_1024UL>,_18446744073709551615UL> local_20;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> local_10;
  
  local_30 = in_RSI;
  for (local_38 = 0; local_38 < local_30; local_38 = sVar2 + local_38) {
    sVar2 = minz(0x100,local_30 - local_38);
    local_444 = in_RDI->_M_elems[0x10b];
    if (((uint)in_RDI->_M_elems[0x108] & 1) == 0) {
      for (local_460 = 0; local_460 < sVar2; local_460 = local_460 + 1) {
        if (1.0 <= local_444) {
          if (1.0 < local_444) {
            local_444 = maxf(local_444 * in_RDI->_M_elems[0x10a],1.0);
          }
        }
        else {
          local_444 = minf(local_444 * in_RDI->_M_elems[0x109],1.0);
        }
        afStack_438[local_460] = 1.0 / local_444;
      }
    }
    else {
      for (local_450 = 0; local_450 < sVar2; local_450 = local_450 + 1) {
        al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::operator[](&local_10,0);
        pvVar3 = std::array<float,_1024UL>::operator[]
                           (in_RDI,CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        std::fabs((double)(ulong)(uint)*pvVar3);
        fVar7 = clampf((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_stack_fffffffffffffb2c);
        if (fVar7 <= local_444) {
          if (fVar7 < local_444) {
            local_444 = maxf(local_444 * in_RDI->_M_elems[0x10a],fVar7);
          }
        }
        else {
          local_444 = minf(local_444 * in_RDI->_M_elems[0x109],fVar7);
        }
        afStack_438[local_450] = 1.0 / local_444;
      }
    }
    in_RDI->_M_elems[0x10b] = local_444;
    pfVar1 = in_RDI->_M_elems;
    local_480 = al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::begin(&local_10);
    paVar4 = al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::end(&local_10);
    local_470 = pfVar1 + 8;
    for (; local_480 != paVar4; local_480 = local_480 + 1) {
      local_498 = local_470;
      local_4a8 = al::span<std::array<float,_1024UL>,_18446744073709551615UL>::begin(&local_20);
      paVar5 = al::span<std::array<float,_1024UL>,_18446744073709551615UL>::end(&local_20);
      for (; local_4a8 != paVar5; local_4a8 = local_4a8 + 1) {
        fVar7 = *local_498;
        dVar8 = std::fabs((double)(ulong)(uint)fVar7);
        if (1e-05 < SUB84(dVar8,0)) {
          for (local_4c8 = 0; local_4c8 < sVar2; local_4c8 = local_4c8 + 1) {
            pvVar3 = std::array<float,_1024UL>::operator[]
                               (in_RDI,CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                               );
            in_stack_fffffffffffffb28 = *pvVar3 * afStack_438[local_4c8];
            in_stack_fffffffffffffb2c = fVar7;
            pvVar6 = std::array<float,_1024UL>::operator[]
                               (in_RDI,CONCAT44(fVar7,in_stack_fffffffffffffb28));
            *pvVar6 = in_stack_fffffffffffffb28 * in_stack_fffffffffffffb2c + *pvVar6;
          }
        }
        local_498 = local_498 + 1;
      }
      local_470 = local_470 + 0x10;
    }
  }
  return;
}

Assistant:

void CompressorState::process(const size_t samplesToDo,
    const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    for(size_t base{0u};base < samplesToDo;)
    {
        float gains[256];
        const size_t td{minz(256, samplesToDo-base)};

        /* Generate the per-sample gains from the signal envelope. */
        float env{mEnvFollower};
        if(mEnabled)
        {
            for(size_t i{0u};i < td;++i)
            {
                /* Clamp the absolute amplitude to the defined envelope limits,
                 * then attack or release the envelope to reach it.
                 */
                const float amplitude{clampf(std::fabs(samplesIn[0][base+i]), AMP_ENVELOPE_MIN,
                    AMP_ENVELOPE_MAX)};
                if(amplitude > env)
                    env = minf(env*mAttackMult, amplitude);
                else if(amplitude < env)
                    env = maxf(env*mReleaseMult, amplitude);

                /* Apply the reciprocal of the envelope to normalize the volume
                 * (compress the dynamic range).
                 */
                gains[i] = 1.0f / env;
            }
        }
        else
        {
            /* Same as above, except the amplitude is forced to 1. This helps
             * ensure smooth gain changes when the compressor is turned on and
             * off.
             */
            for(size_t i{0u};i < td;++i)
            {
                const float amplitude{1.0f};
                if(amplitude > env)
                    env = minf(env*mAttackMult, amplitude);
                else if(amplitude < env)
                    env = maxf(env*mReleaseMult, amplitude);

                gains[i] = 1.0f / env;
            }
        }
        mEnvFollower = env;

        /* Now compress the signal amplitude to output. */
        auto changains = std::addressof(mGain[0]);
        for(const auto &input : samplesIn)
        {
            const float *outgains{*(changains++)};
            for(FloatBufferLine &output : samplesOut)
            {
                const float gain{*(outgains++)};
                if(!(std::fabs(gain) > GainSilenceThreshold))
                    continue;

                for(size_t i{0u};i < td;i++)
                    output[base+i] += input[base+i] * gains[i] * gain;
            }
        }

        base += td;
    }
}